

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O3

void anon_unknown.dwarf_1f7001::releasePixels
               (int type,Array2D<unsigned_int_*> *uintData,Array2D<float_*> *floatData,
               Array2D<Imath_3_2::half_*> *halfData,int x1,int x2,int y1,int y2)

{
  long lVar1;
  half **pphVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  if (y1 <= y2) {
    lVar1 = (long)y1;
    lVar3 = lVar1 * 8;
    do {
      lVar5 = (long)x1;
      iVar4 = (x2 - x1) + 1;
      if (x1 <= x2) {
        do {
          if (type == 2) {
            pphVar2 = (half **)(halfData->_sizeY * lVar3 + (long)halfData->_data);
LAB_001821e3:
            if (pphVar2[lVar5] != (half *)0x0) {
              operator_delete__(pphVar2[lVar5]);
            }
          }
          else {
            if (type == 1) {
              pphVar2 = (half **)(floatData->_sizeY * lVar3 + (long)floatData->_data);
              goto LAB_001821e3;
            }
            if (type == 0) {
              pphVar2 = (half **)(uintData->_sizeY * lVar3 + (long)uintData->_data);
              goto LAB_001821e3;
            }
          }
          lVar5 = lVar5 + 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      lVar1 = lVar1 + 1;
      lVar3 = lVar3 + 8;
    } while (y2 + 1 != (int)lVar1);
  }
  return;
}

Assistant:

void
releasePixels (
    int                     type,
    Array2D<unsigned int*>& uintData,
    Array2D<float*>&        floatData,
    Array2D<half*>&         halfData,
    int                     x1,
    int                     x2,
    int                     y1,
    int                     y2)
{
    for (int y = y1; y <= y2; y++)
    {
        for (int x = x1; x <= x2; x++)
        {
            if (type == 0) delete[] uintData[y][x];
            if (type == 1) delete[] floatData[y][x];
            if (type == 2) delete[] halfData[y][x];
        }
    }
}